

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSurfaceAccess.hpp
# Opt level: O0

deUint8 tcu::getColorMask(PixelFormat *format)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  PixelFormat *format_local;
  
  bVar1 = 0;
  if (format->greenBits != 0) {
    bVar1 = 2;
  }
  bVar2 = 0;
  if (format->blueBits != 0) {
    bVar2 = 4;
  }
  bVar3 = 0;
  if (format->alphaBits != 0) {
    bVar3 = 8;
  }
  return format->redBits != 0 | bVar1 | bVar2 | bVar3;
}

Assistant:

inline deUint8 getColorMask (const tcu::PixelFormat& format)
{
	return (deUint8)((format.redBits	? tcu::RGBA::RED_MASK	: 0) |
					 (format.greenBits	? tcu::RGBA::GREEN_MASK	: 0) |
					 (format.blueBits	? tcu::RGBA::BLUE_MASK	: 0) |
					 (format.alphaBits	? tcu::RGBA::ALPHA_MASK	: 0));
}